

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O1

void Omega_h::project_classification
               (Mesh *mesh,Int ent_dim,Write<signed_char> *class_dim,Write<int> *class_id,
               bool relaxed)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  int iVar4;
  LO LVar5;
  int iVar6;
  element_type *peVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  IntIterator last;
  LOs lh2h;
  LOs l2lh;
  type f;
  Read<int> high_class_id;
  Read<signed_char> high_class_dim;
  Adj l2h;
  Alloc *local_1f0;
  Alloc *local_1e0;
  Alloc *local_1c8;
  void *local_1c0;
  Alloc *local_1b8;
  pointer local_1b0;
  Alloc *local_1a8;
  element_type *local_1a0;
  Alloc *local_198;
  element_type *local_190;
  Alloc *local_188;
  element_type *local_180;
  Alloc *local_178;
  element_type *local_170;
  undefined4 local_168;
  uint uStack_164;
  Alloc *local_160;
  void *local_158;
  undefined1 local_150 [56];
  element_type *local_118;
  Alloc *local_110;
  element_type *local_108;
  pointer local_100;
  Alloc *local_f8;
  element_type *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  element_type *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  void *pvStack_d0;
  Alloc *local_c8;
  pointer psStack_c0;
  Alloc *local_b8;
  element_type *peStack_b0;
  Alloc *local_a8;
  element_type *peStack_a0;
  Alloc *local_98;
  element_type *peStack_90;
  Alloc *local_88;
  element_type *peStack_80;
  pointer local_78;
  element_type *local_68;
  Adj local_60;
  
  uVar10 = ent_dim + 1;
  Mesh::ask_up(&local_60,mesh,ent_dim,uVar10);
  local_1e0 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e0 = (Alloc *)((long)(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_1f0 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f0 = (Alloc *)((long)(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_160 = (Alloc *)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_e8,(Int)mesh,(string *)(ulong)uVar10);
  if (local_160 != (Alloc *)local_150) {
    operator_delete(local_160,(ulong)((long)(size_t *)local_150._0_8_ + 1));
  }
  local_160 = (Alloc *)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"class_id","");
  Mesh::get_array<int>((Mesh *)&local_f8,(Int)mesh,(string *)(ulong)uVar10);
  if (local_160 != (Alloc *)local_150) {
    operator_delete(local_160,(ulong)((long)(size_t *)local_150._0_8_ + 1));
  }
  local_1c8 = (class_dim->shared_alloc_).alloc;
  if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8 = (Alloc *)(local_1c8->size * 8 + 1);
    }
    else {
      local_1c8->use_count = local_1c8->use_count + 1;
    }
  }
  local_1c0 = (class_dim->shared_alloc_).direct_ptr;
  local_1b8 = (class_id->shared_alloc_).alloc;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    else {
      local_1b8->use_count = local_1b8->use_count + 1;
    }
  }
  local_1b0 = (pointer)(class_id->shared_alloc_).direct_ptr;
  local_1a8 = local_1e0;
  if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)(local_1e0->size * 8 + 1);
    }
    else {
      local_1e0->use_count = local_1e0->use_count + 1;
    }
  }
  local_1a0 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_198 = local_1f0;
  if (((ulong)local_1f0 & 7) == 0 && local_1f0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (Alloc *)(local_1f0->size * 8 + 1);
    }
    else {
      local_1f0->use_count = local_1f0->use_count + 1;
    }
  }
  local_190 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_188 = (Alloc *)local_e8._M_pi;
  if (((ulong)local_e8._M_pi & 7) == 0 && (Alloc *)local_e8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (Alloc *)((long)(local_e8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_e8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_e8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_180 = local_e0;
  local_178 = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178 = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  local_170 = local_f0;
  local_168 = CONCAT31(local_168._1_3_,relaxed);
  uStack_164 = ent_dim;
  LVar5 = Mesh::nents(mesh,ent_dim);
  local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8;
  if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1c8->size * 8 + 1);
    }
    else {
      local_1c8->use_count = local_1c8->use_count + 1;
    }
  }
  pvStack_d0 = local_1c0;
  local_c8 = local_1b8;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    else {
      local_1b8->use_count = local_1b8->use_count + 1;
    }
  }
  psStack_c0 = local_1b0;
  local_b8 = local_1a8;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    else {
      local_1a8->use_count = local_1a8->use_count + 1;
    }
  }
  peStack_b0 = local_1a0;
  local_a8 = local_198;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  peStack_a0 = local_190;
  local_98 = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  peStack_90 = local_180;
  local_88 = local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_178->size * 8 + 1);
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  local_78 = (pointer)CONCAT44(uStack_164,local_168);
  peStack_80 = local_170;
  if (0 < LVar5) {
    local_160 = (Alloc *)local_d8._M_pi;
    local_158 = local_1c0;
    if (((ulong)local_d8._M_pi & 7) == 0 && (Alloc *)local_d8._M_pi != (Alloc *)0x0) {
      *(int *)&local_d8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_d8._M_pi[3]._vptr__Sp_counted_base + -1;
      local_160 = (Alloc *)((long)(local_d8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pvStack_d0 = (void *)0x0;
    local_150._0_8_ = local_c8;
    local_150._8_8_ = local_1b0;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_150._0_8_ = local_c8->size * 8 + 1;
    }
    local_c8 = (Alloc *)0x0;
    psStack_c0 = (pointer)0x0;
    local_150._16_8_ = local_b8;
    local_150._24_8_ = local_1a0;
    if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
      local_b8->use_count = local_b8->use_count + -1;
      local_150._16_8_ = local_b8->size * 8 + 1;
    }
    local_b8 = (Alloc *)0x0;
    peStack_b0 = (element_type *)0x0;
    local_150._32_8_ = local_a8;
    local_150._40_8_ = local_190;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      local_a8->use_count = local_a8->use_count + -1;
      local_150._32_8_ = local_a8->size * 8 + 1;
    }
    local_a8 = (Alloc *)0x0;
    peStack_a0 = (element_type *)0x0;
    local_150._48_8_ = local_98;
    local_118 = local_180;
    if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
      local_98->use_count = local_98->use_count + -1;
      local_150._48_8_ = local_98->size * 8 + 1;
    }
    local_98 = (Alloc *)0x0;
    peStack_90 = (element_type *)0x0;
    local_110 = local_88;
    local_108 = local_170;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      local_88->use_count = local_88->use_count + -1;
      local_110 = (Alloc *)(local_88->size * 8 + 1);
    }
    local_88 = (Alloc *)0x0;
    peStack_80 = (element_type *)0x0;
    entering_parallel = '\0';
    local_68 = (element_type *)(ulong)uStack_164;
    lVar12 = 0;
    do {
      peVar7 = (element_type *)(ulong)(uint)(int)*(char *)((long)local_1c0 + lVar12);
      iVar6 = *(int *)((long)&(local_1b0->
                              super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + lVar12 * 4);
      iVar3 = *(int *)((long)&(local_1a0->super_Graph).a2ab.write_.shared_alloc_.alloc + lVar12 * 4)
      ;
      lVar11 = (long)iVar3;
      iVar4 = *(int *)((long)&(local_1a0->super_Graph).a2ab.write_.shared_alloc_.alloc +
                      lVar12 * 4 + 4);
      iVar9 = 0;
      if (iVar3 < iVar4) {
        do {
          lVar13 = (long)*(int *)((long)&(local_190->super_Graph).a2ab.write_.shared_alloc_.alloc +
                                 lVar11 * 4);
          uVar8 = (uint)*(char *)((long)&local_180->library_ + lVar13);
          iVar3 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                    *)&local_170->library_)->_M_ptr + lVar13 * 4);
          uVar10 = (uint)peVar7;
          if ((int)uVar8 < (int)uVar10) {
            iVar9 = 1;
            peVar7 = (element_type *)(ulong)uVar8;
            iVar6 = iVar3;
          }
          else if (uVar10 == uVar8) {
            if ((iVar3 == iVar6) || ((iVar3 == -1 & (byte)local_168) != 0)) {
              iVar9 = iVar9 + 1;
            }
            else if (iVar6 == -1) {
              iVar9 = iVar9 + 1;
              iVar6 = iVar3;
            }
            else {
              peVar7 = (element_type *)(ulong)(uVar10 - 1);
              iVar6 = -1;
              iVar9 = 0;
            }
          }
          lVar11 = lVar11 + 1;
        } while (iVar4 != lVar11);
      }
      if (((iVar9 != 2) && ((int)peVar7 == uStack_164 + 1)) ||
         ((iVar9 < 2 && ((int)(uStack_164 + 1) < (int)peVar7)))) {
        iVar6 = -1;
        peVar7 = local_68;
      }
      *(char *)((long)local_1c0 + lVar12) = (char)peVar7;
      *(int *)((long)&(local_1b0->
                      super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              + lVar12 * 4) = iVar6;
      lVar12 = lVar12 + 1;
    } while (LVar5 != (int)lVar12);
    local_100 = local_78;
    project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)
    ::$_0::~__0((__0 *)&local_160);
  }
  project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)::
  $_0::~__0((__0 *)&local_d8);
  project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)::
  $_0::~__0((__0 *)&local_1c8);
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    piVar1 = &local_f8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_f8);
      operator_delete(local_f8,0x48);
    }
  }
  if (((ulong)local_e8._M_pi & 7) == 0 && (Alloc *)local_e8._M_pi != (Alloc *)0x0) {
    p_Var2 = local_e8._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_e8._M_pi);
      operator_delete(local_e8._M_pi,0x48);
    }
  }
  if (((ulong)local_1f0 & 7) == 0 && local_1f0 != (Alloc *)0x0) {
    piVar1 = &local_1f0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1f0);
      operator_delete(local_1f0,0x48);
    }
  }
  if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
    piVar1 = &local_1e0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1e0);
      operator_delete(local_1e0,0x48);
    }
  }
  Adj::~Adj(&local_60);
  return;
}

Assistant:

void project_classification(Mesh* mesh, Int ent_dim, Write<I8> class_dim,
    Write<ClassId> class_id, bool relaxed) {
  auto l2h = mesh->ask_up(ent_dim, ent_dim + 1);
  auto l2lh = l2h.a2ab;
  auto lh2h = l2h.ab2b;
  auto high_class_dim = mesh->get_array<I8>(ent_dim + 1, "class_dim");
  auto high_class_id = mesh->get_array<ClassId>(ent_dim + 1, "class_id");
  auto f = OMEGA_H_LAMBDA(LO l) {
    Int best_dim = class_dim[l];
    auto best_id = class_id[l];
    Int nadj = 0;
    for (auto lh = l2lh[l]; lh < l2lh[l + 1]; ++lh) {
      auto h = lh2h[lh];
      Int high_dim = high_class_dim[h];
      auto high_id = high_class_id[h];
      if (high_dim < best_dim) {
        best_dim = high_dim;
        best_id = high_id;
        nadj = 1;
      } else if (high_dim == best_dim) {
        if (high_id != best_id && (!relaxed || high_id != -1)) {
          if (best_id == -1) {
            best_id = high_id;
            ++nadj;
          } else {
            --best_dim;
            best_id = -1;
            nadj = 0;
          }
        } else {
          ++nadj;
        }
      }
    }
    if ((nadj != 2 && best_dim == ent_dim + 1) ||
        (nadj < 2 && best_dim > ent_dim + 1)) {
      best_dim = ent_dim;
      best_id = -1;
    }
    class_dim[l] = static_cast<I8>(best_dim);
    class_id[l] = best_id;
  };
  parallel_for(mesh->nents(ent_dim), f, "project_classification");
}